

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::doWalkModule
          (Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *this,
          Module *module)

{
  Table *pTVar1;
  pointer puVar2;
  pointer puVar3;
  Global *pGVar4;
  pointer puVar5;
  Function *pFVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  pointer puVar12;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  pointer puVar13;
  pointer puVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  pointer puVar18;
  pointer puVar19;
  
  pTVar1 = (Table *)(this[-1].stack.fixed._M_elems + 7);
  puVar2 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar13 = (module->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar2; puVar13 = puVar13 + 1
      ) {
    wasm::ReFinalize::visitExport((Export *)pTVar1);
  }
  puVar3 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar12 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3; puVar12 = puVar12 + 1
      ) {
    pGVar4 = (puVar12->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar4->super_Importable).module + 8) == (char *)0x0) {
      walk(this,&pGVar4->init);
    }
    wasm::ReFinalize::visitGlobal((Global *)pTVar1);
  }
  puVar5 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar14 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar5; puVar14 = puVar14 + 1
      ) {
    pFVar6 = (puVar14->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar6->super_Importable).module + 8) == (char *)0x0) {
      this->currFunction = pFVar6;
      walk(this,&pFVar6->body);
      this->currFunction = (Function *)0x0;
    }
  }
  puVar7 = (module->tags).
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar15 = (module->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar7; puVar15 = puVar15 + 1
      ) {
    wasm::ReFinalize::visitTag((Tag *)pTVar1);
  }
  puVar8 = (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar16 = (module->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar8; puVar16 = puVar16 + 1
      ) {
    walkElementSegment(this,(puVar16->_M_t).
                            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
  }
  puVar9 = (module->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar17 = (module->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar9; puVar17 = puVar17 + 1
      ) {
    wasm::ReFinalize::visitTable(pTVar1);
  }
  puVar10 = (module->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar18 = (module->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar10;
      puVar18 = puVar18 + 1) {
    walkDataSegment(this,(puVar18->_M_t).
                         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                         .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  }
  puVar11 = (module->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (module->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar11;
      puVar19 = puVar19 + 1) {
    wasm::ReFinalize::visitMemory((Memory *)pTVar1);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Dispatch statically through the SubType.
    SubType* self = static_cast<SubType*>(this);
    for (auto& curr : module->exports) {
      self->visitExport(curr.get());
    }
    for (auto& curr : module->globals) {
      if (curr->imported()) {
        self->visitGlobal(curr.get());
      } else {
        self->walkGlobal(curr.get());
      }
    }
    for (auto& curr : module->functions) {
      if (curr->imported()) {
        self->visitFunction(curr.get());
      } else {
        self->walkFunction(curr.get());
      }
    }
    for (auto& curr : module->tags) {
      if (curr->imported()) {
        self->visitTag(curr.get());
      } else {
        self->walkTag(curr.get());
      }
    }
    for (auto& curr : module->elementSegments) {
      self->walkElementSegment(curr.get());
    }
    for (auto& curr : module->tables) {
      self->walkTable(curr.get());
    }
    for (auto& curr : module->dataSegments) {
      self->walkDataSegment(curr.get());
    }
    for (auto& curr : module->memories) {
      self->walkMemory(curr.get());
    }
  }